

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

date_t duckdb::Timestamp::GetDate(timestamp_t timestamp)

{
  if (timestamp.value == 0x7fffffffffffffff) {
    return (date_t)0x7fffffff;
  }
  if (timestamp.value != -0x7fffffffffffffff) {
    return (date_t)((int)((timestamp.value - (timestamp.value >> 0x3f)) / 86400000000) +
                   (int)(timestamp.value >> 0x3f));
  }
  return (date_t)-0x7fffffff;
}

Assistant:

date_t Timestamp::GetDate(timestamp_t timestamp) {
	if (DUCKDB_UNLIKELY(timestamp == timestamp_t::infinity())) {
		return date_t::infinity();
	}
	if (DUCKDB_UNLIKELY(timestamp == timestamp_t::ninfinity())) {
		return date_t::ninfinity();
	}
	return date_t(UnsafeNumericCast<int32_t>((timestamp.value + (timestamp.value < 0)) / Interval::MICROS_PER_DAY -
	                                         (timestamp.value < 0)));
}